

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

int __thiscall FBlockLinesIterator::init(FBlockLinesIterator *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  double dVar2;
  FBoundingBox *box_local;
  FBlockLinesIterator *this_local;
  
  validcount = validcount + 1;
  dVar2 = FBoundingBox::Top((FBoundingBox *)ctx);
  iVar1 = GetBlockY(dVar2);
  this->maxy = iVar1;
  dVar2 = FBoundingBox::Bottom((FBoundingBox *)ctx);
  iVar1 = GetBlockY(dVar2);
  this->miny = iVar1;
  dVar2 = FBoundingBox::Right((FBoundingBox *)ctx);
  iVar1 = GetBlockX(dVar2);
  this->maxx = iVar1;
  dVar2 = FBoundingBox::Left((FBoundingBox *)ctx);
  iVar1 = GetBlockX(dVar2);
  this->minx = iVar1;
  Reset(this);
  return extraout_EAX;
}

Assistant:

void FBlockLinesIterator::init(const FBoundingBox &box)
{
	validcount++;
	maxy = GetBlockY(box.Top());
	miny = GetBlockY(box.Bottom());
	maxx = GetBlockX(box.Right());
	minx = GetBlockX(box.Left());
	Reset();
}